

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel_p.h
# Opt level: O0

void __thiscall
QFileSystemModelPrivate::QFileSystemNode::QFileSystemNode
          (QFileSystemNode *this,QString *filename,QFileSystemNode *p)

{
  qsizetype in_RDX;
  QString *in_RDI;
  QString *in_stack_ffffffffffffffd8;
  
  QString::QString(in_RDI,in_stack_ffffffffffffffd8);
  QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::QHash
            ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)(in_RDI + 1));
  QList<QString>::QList((QList<QString> *)0xaaefb7);
  in_RDI[2].d.ptr = (char16_t *)0x0;
  in_RDI[2].d.size = in_RDX;
  *(undefined4 *)&in_RDI[3].d.d = 0xffffffff;
  *(undefined1 *)((long)&in_RDI[3].d.d + 4) = 0;
  *(undefined1 *)((long)&in_RDI[3].d.d + 5) = 0;
  return;
}

Assistant:

explicit QFileSystemNode(const QString &filename = QString(), QFileSystemNode *p = nullptr)
            : fileName(filename), parent(p) {}